

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int fits_img_stats_int(int *array,long nx,long ny,int nullcheck,int nullvalue,long *ngoodpix,
                      int *minvalue,int *maxvalue,double *mean,double *sigma,double *noise1,
                      double *noise2,double *noise3,double *noise5,int *status)

{
  double local_88;
  double xnoise5;
  double xnoise3;
  double xnoise2;
  double xnoise;
  double xsigma;
  double xmean;
  int maxval;
  int minval;
  long ngood;
  long *ngoodpix_local;
  int nullvalue_local;
  int nullcheck_local;
  long ny_local;
  long nx_local;
  int *array_local;
  
  xmean._4_4_ = 0;
  xmean._0_4_ = 0;
  xsigma = 0.0;
  xnoise = 0.0;
  xnoise2 = 0.0;
  xnoise3 = 0.0;
  xnoise5 = 0.0;
  local_88 = 0.0;
  ngood = (long)ngoodpix;
  ngoodpix_local._0_4_ = nullvalue;
  ngoodpix_local._4_4_ = nullcheck;
  _nullvalue_local = ny;
  ny_local = nx;
  nx_local = (long)array;
  if ((mean != (double *)0x0) || (sigma != (double *)0x0)) {
    FnMeanSigma_int(array,nx * ny,nullcheck,nullvalue,(long *)&maxval,&xsigma,&xnoise,status);
    if (ngood != 0) {
      *(long *)ngood = _maxval;
    }
    if (mean != (double *)0x0) {
      *mean = xsigma;
    }
    if (sigma != (double *)0x0) {
      *sigma = xnoise;
    }
  }
  if (noise1 != (double *)0x0) {
    FnNoise1_int((int *)nx_local,ny_local,_nullvalue_local,ngoodpix_local._4_4_,(int)ngoodpix_local,
                 &xnoise2,status);
    *noise1 = xnoise2;
  }
  if (((minvalue != (int *)0x0) || (maxvalue != (int *)0x0)) || (noise3 != (double *)0x0)) {
    FnNoise5_int((int *)nx_local,ny_local,_nullvalue_local,ngoodpix_local._4_4_,(int)ngoodpix_local,
                 (long *)&maxval,(int *)((long)&xmean + 4),(int *)&xmean,&xnoise3,&xnoise5,&local_88
                 ,status);
    if (ngood != 0) {
      *(long *)ngood = _maxval;
    }
    if (minvalue != (int *)0x0) {
      *minvalue = xmean._4_4_;
    }
    if (maxvalue != (int *)0x0) {
      *maxvalue = xmean._0_4_;
    }
    if (noise2 != (double *)0x0) {
      *noise2 = xnoise3;
    }
    if (noise3 != (double *)0x0) {
      *noise3 = xnoise5;
    }
    if (noise5 != (double *)0x0) {
      *noise5 = local_88;
    }
  }
  return *status;
}

Assistant:

int fits_img_stats_int(int *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	int nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	int *minvalue,    /* returned minimum non-null value in the array */
	int *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input integer image.
*/
{
	long ngood;
	int minval = 0, maxval = 0;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_int(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_int(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_int(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}